

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomActionGroup::~DomActionGroup(DomActionGroup *this)

{
  QList<DomProperty_*> *in_RDI;
  
  qDeleteAll<QList<DomAction*>>((QList<DomAction_*> *)in_RDI);
  QList<DomAction_*>::clear((QList<DomAction_*> *)in_RDI);
  qDeleteAll<QList<DomActionGroup*>>((QList<DomActionGroup_*> *)in_RDI);
  QList<DomActionGroup_*>::clear((QList<DomActionGroup_*> *)in_RDI);
  qDeleteAll<QList<DomProperty*>>(in_RDI);
  QList<DomProperty_*>::clear(in_RDI);
  qDeleteAll<QList<DomProperty*>>(in_RDI);
  QList<DomProperty_*>::clear(in_RDI);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1a4ca0);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1a4cae);
  QList<DomActionGroup_*>::~QList((QList<DomActionGroup_*> *)0x1a4cbc);
  QList<DomAction_*>::~QList((QList<DomAction_*> *)0x1a4cca);
  QString::~QString((QString *)0x1a4cd4);
  return;
}

Assistant:

DomActionGroup::~DomActionGroup()
{
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
}